

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::MergeMaterials
               (aiMaterial **dest,const_iterator begin,const_iterator end)

{
  char *pKey;
  aiMaterialProperty *paVar1;
  aiReturn aVar2;
  const_iterator it;
  aiMaterial *this;
  const_iterator cVar3;
  aiMaterialProperty **ppaVar4;
  aiMaterial *paVar5;
  aiMaterialProperty *paVar6;
  char *__dest;
  uint uVar7;
  ulong uVar8;
  aiMaterialProperty *prop_exist;
  aiMaterialProperty *local_38;
  
  if (dest != (aiMaterial **)0x0) {
    if (begin._M_current == end._M_current) {
      *dest = (aiMaterial *)0x0;
    }
    else {
      this = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this);
      *dest = this;
      uVar7 = 0;
      cVar3._M_current = begin._M_current;
      do {
        uVar7 = uVar7 + (*cVar3._M_current)->mNumProperties;
        cVar3._M_current = cVar3._M_current + 1;
      } while (cVar3._M_current != end._M_current);
      aiMaterial::Clear(this);
      if (this->mProperties != (aiMaterialProperty **)0x0) {
        operator_delete__(this->mProperties);
      }
      this->mNumAllocated = uVar7;
      this->mNumProperties = 0;
      ppaVar4 = (aiMaterialProperty **)operator_new__((ulong)uVar7 << 3);
      this->mProperties = ppaVar4;
      do {
        paVar5 = *begin._M_current;
        if (paVar5->mNumProperties != 0) {
          uVar8 = 0;
          do {
            paVar1 = paVar5->mProperties[uVar8];
            pKey = (paVar1->mKey).data;
            aVar2 = aiGetMaterialProperty(this,pKey,paVar1->mSemantic,paVar1->mIndex,&local_38);
            if (aVar2 != aiReturn_SUCCESS) {
              paVar6 = (aiMaterialProperty *)operator_new(0x420);
              (paVar6->mKey).length = 0;
              (paVar6->mKey).data[0] = '\0';
              memset((paVar6->mKey).data + 1,0x1b,0x3ff);
              paVar6->mSemantic = 0;
              paVar6->mIndex = 0;
              paVar6->mDataLength = 0;
              paVar6->mType = aiPTI_Float;
              paVar6->mData = (char *)0x0;
              this->mProperties[this->mNumProperties] = paVar6;
              uVar7 = paVar1->mDataLength;
              paVar6->mDataLength = uVar7;
              __dest = (char *)operator_new__((ulong)uVar7);
              paVar6->mData = __dest;
              memcpy(__dest,paVar1->mData,(ulong)uVar7);
              paVar6->mIndex = paVar1->mIndex;
              paVar6->mSemantic = paVar1->mSemantic;
              if (paVar6 != paVar1) {
                uVar7 = (paVar1->mKey).length;
                (paVar6->mKey).length = uVar7;
                memcpy((paVar6->mKey).data,pKey,(ulong)uVar7);
                (paVar6->mKey).data[uVar7] = '\0';
              }
              paVar6->mType = paVar1->mType;
              this->mNumProperties = this->mNumProperties + 1;
            }
            uVar8 = uVar8 + 1;
            paVar5 = *begin._M_current;
          } while (uVar8 < paVar5->mNumProperties);
        }
        begin._M_current = begin._M_current + 1;
      } while (begin._M_current != end._M_current);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeMaterials(aiMaterial** dest,
        std::vector<aiMaterial*>::const_iterator begin,
        std::vector<aiMaterial*>::const_iterator end)
{
    if ( nullptr == dest ) {
        return;
    }

    if (begin == end)   {
        *dest = NULL; // no materials ...
        return;
    }

    // Allocate the output material
    aiMaterial* out = *dest = new aiMaterial();

    // Get the maximal number of properties
    unsigned int size = 0;
    for (std::vector<aiMaterial*>::const_iterator it = begin; it != end; ++it) {
        size += (*it)->mNumProperties;
    }

    out->Clear();
    delete[] out->mProperties;

    out->mNumAllocated = size;
    out->mNumProperties = 0;
    out->mProperties = new aiMaterialProperty*[out->mNumAllocated];

    for (std::vector<aiMaterial*>::const_iterator it = begin; it != end; ++it) {
        for(unsigned int i = 0; i < (*it)->mNumProperties; ++i) {
            aiMaterialProperty* sprop = (*it)->mProperties[i];

            // Test if we already have a matching property
            const aiMaterialProperty* prop_exist;
            if(aiGetMaterialProperty(out, sprop->mKey.C_Str(), sprop->mSemantic, sprop->mIndex, &prop_exist) != AI_SUCCESS) {
                // If not, we add it to the new material
                aiMaterialProperty* prop = out->mProperties[out->mNumProperties] = new aiMaterialProperty();

                prop->mDataLength = sprop->mDataLength;
                prop->mData = new char[prop->mDataLength];
                ::memcpy(prop->mData, sprop->mData, prop->mDataLength);

                prop->mIndex    = sprop->mIndex;
                prop->mSemantic = sprop->mSemantic;
                prop->mKey      = sprop->mKey;
                prop->mType     = sprop->mType;

                out->mNumProperties++;
            }
        }
    }
}